

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_string_vector.cc
# Opt level: O3

vector<absl::string_view,_std::allocator<absl::string_view>_> * __thiscall
s2coding::EncodedStringVector::Decode
          (vector<absl::string_view,_std::allocator<absl::string_view>_> *__return_storage_ptr__,
          EncodedStringVector *this)

{
  pointer psVar1;
  unsigned_long_long uVar2;
  unsigned_long_long uVar3;
  undefined8 extraout_RAX;
  int i;
  long lVar4;
  ulong __n;
  allocator_type local_31;
  
  __n = (ulong)(this->offsets_).size_;
  std::vector<absl::string_view,_std::allocator<absl::string_view>_>::vector
            (__return_storage_ptr__,__n,&local_31);
  if (__n != 0) {
    i = -1;
    lVar4 = 0;
    do {
      if (lVar4 == 0) {
        uVar2 = 0;
      }
      else {
        uVar2 = EncodedUintVector<unsigned_long_long>::operator[](&this->offsets_,i);
      }
      i = i + 1;
      uVar3 = EncodedUintVector<unsigned_long_long>::operator[](&this->offsets_,i);
      if ((long)(uVar3 - uVar2) < 0) {
        Decode();
        psVar1 = (__return_storage_ptr__->
                 super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (psVar1 != (pointer)0x0) {
          operator_delete(psVar1);
        }
        _Unwind_Resume(extraout_RAX);
      }
      psVar1 = (__return_storage_ptr__->
               super__Vector_base<absl::string_view,_std::allocator<absl::string_view>_>)._M_impl.
               super__Vector_impl_data._M_start;
      *(char **)((long)&psVar1->ptr_ + lVar4) = this->data_ + uVar2;
      *(unsigned_long_long *)((long)&psVar1->length_ + lVar4) = uVar3 - uVar2;
      lVar4 = lVar4 + 0x10;
    } while (__n << 4 != lVar4);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<string_view> EncodedStringVector::Decode() const {
  size_t n = size();
  vector<string_view> result(n);
  for (int i = 0; i < n; ++i) {
    result[i] = (*this)[i];
  }
  return result;
}